

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O1

void xercesc_4_0::XMLString::upperCaseASCII(XMLCh *toUpperCase)

{
  XMLCh XVar1;
  XMLCh *psz1;
  XMLCh *pXVar2;
  
  if ((toUpperCase != (XMLCh *)0x0) && (XVar1 = *toUpperCase, XVar1 != L'\0')) {
    pXVar2 = toUpperCase + 1;
    do {
      if ((ushort)(XVar1 + L'ﾟ') < 0x1a) {
        pXVar2[-1] = XVar1 + L'￠';
      }
      XVar1 = *pXVar2;
      pXVar2 = pXVar2 + 1;
    } while (XVar1 != L'\0');
  }
  return;
}

Assistant:

void XMLString::upperCaseASCII(XMLCh* const toUpperCase)
{
    XMLCh* psz1 = toUpperCase;

    if (!psz1)
        return;

    while (*psz1) {
        if (*psz1 >= chLatin_a && *psz1 <= chLatin_z)
            *psz1 = *psz1 - chLatin_a + chLatin_A;

        psz1++;
    }
}